

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O3

char16 * Js::NarrowStringToWide(Context *ctx,char *src,size_t *srcSize,charcount_t *dstSize)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t cVar4;
  size_t sVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  ulong uVar8;
  size_t requestedBytes;
  long lVar9;
  
  if (srcSize == (size_t *)0x0) {
    sVar5 = strlen(src);
  }
  else {
    sVar5 = *srcSize;
  }
  uVar8 = sVar5 * 2 + 2;
  if (uVar8 < sVar5) {
LAB_00d9223b:
    JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
  }
  if (sVar5 * 2 == -2) {
    pcVar7 = (char16 *)&DAT_00000008;
  }
  else {
    this = &ctx->allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
    ;
    requestedBytes = 0xffffffffffffffff;
    if (-1 < (long)uVar8) {
      requestedBytes = (sVar5 + 1) * 4;
    }
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00d92248;
      *puVar6 = 0;
    }
    pcVar7 = (char16 *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(this,requestedBytes);
    if (pcVar7 == (char16 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (bVar2) {
        *puVar6 = 0;
        goto LAB_00d9223b;
      }
      goto LAB_00d92248;
    }
  }
  if (0xfffffffe < sVar5) {
    *pcVar7 = L'\0';
    goto LAB_00d9223b;
  }
  if (sVar5 == 0) {
    lVar9 = 0;
LAB_00d92167:
    if (sVar5 - lVar9 != 0) {
      cVar4 = utf8::ByteIndexIntoCharacterIndex((LPCUTF8)(src + lVar9),sVar5 - lVar9,doDefault);
      cVar4 = (int)lVar9 + cVar4;
      if (sVar5 < cVar4) goto LAB_00d9223b;
      utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                (pcVar7 + lVar9,(LPCUTF8)(src + lVar9),(LPCUTF8)(src + sVar5),doAllowInvalidWCHARs,
                 (bool *)0x0);
      if (pcVar7[cVar4] != L'\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                    ,0xaa,"(destString[*destCount] == 0)",
                                    "destString[*destCount] == 0");
        if (!bVar2) {
LAB_00d92248:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      goto LAB_00d92217;
    }
  }
  else {
    uVar8 = 0;
    do {
      if (src[uVar8] < '\x01') {
        lVar9 = 0;
        if (2 < uVar8) {
          lVar9 = uVar8 - 3;
        }
        goto LAB_00d92167;
      }
      pcVar7[uVar8] = (short)src[uVar8];
      uVar8 = uVar8 + 1;
    } while (sVar5 != uVar8);
  }
  pcVar7[sVar5] = L'\0';
  cVar4 = (charcount_t)sVar5;
LAB_00d92217:
  if (dstSize != (charcount_t *)0x0) {
    *dstSize = cVar4;
  }
  return pcVar7;
}

Assistant:

char16* NarrowStringToWide(Context* ctx, const char* src, const size_t* srcSize = nullptr, charcount_t* dstSize = nullptr)
{
    auto allocator = [&ctx](size_t size) {return (char16*)AnewArray(ctx->allocator, char16, size); };
    char16* dst = nullptr;
    charcount_t size;
    HRESULT hr = utf8::NarrowStringToWide(allocator, src, srcSize ? *srcSize : strlen(src), &dst, &size);
    if (hr != S_OK)
    {
        JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
    }
    if (dstSize)
    {
        *dstSize = size;
    }
    return dst;
}